

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgd-walk.c
# Opt level: O0

void print_task_struct(nettlp *nt,task_struct t)

{
  char cVar1;
  ssize_t sVar2;
  size_t in_stack_00000010;
  void *in_stack_00000018;
  char comm [16];
  long state;
  int ret;
  undefined1 local_28 [15];
  undefined1 local_19;
  long local_18;
  uint local_c;
  
  sVar2 = dma_read((nettlp *)comm._8_8_,comm._0_8_,in_stack_00000018,in_stack_00000010);
  local_c = (uint)sVar2;
  if (local_c < 8) {
    fprintf(_stderr,"failed to read state from %#lx\n",state);
  }
  else {
    sVar2 = dma_read((nettlp *)comm._8_8_,comm._0_8_,in_stack_00000018,in_stack_00000010);
    local_c = (uint)sVar2;
    if (local_c < 0x10) {
      fprintf(_stderr,"failed to read comm from %#lx\n",t.vstate);
    }
    else {
      local_19 = 0;
      cVar1 = state_to_char(local_18);
      printf("%#lx %6d    %c 0x%04lx %s, pgd is %#lx\n",in_stack_00000010,(ulong)(uint)t.pcomm,
             (ulong)(uint)(int)cVar1,local_18,local_28,t.children.next);
    }
  }
  return;
}

Assistant:

void print_task_struct(struct nettlp *nt, struct task_struct t)
{
	int ret;
	long state;
	char comm[TASK_COMM_LEN];

	ret = dma_read(nt, t.pstate, &state, sizeof(state));
	if (ret < sizeof(state)) {
		fprintf(stderr, "failed to read state from %#lx\n", t.pstate);
		return;
	}

	ret = dma_read(nt, t.pcomm, &comm, sizeof(comm));
	if (ret < sizeof(comm)) {
		fprintf(stderr, "failed to read comm from %#lx\n", t.pcomm);
		return;
	}

	comm[TASK_COMM_LEN - 1] = '\0';	/* preventing overflow */

	printf("%#lx %6d    %c 0x%04lx %s, pgd is %#lx\n",
	       t.phead, t.pid, state_to_char(state), state, comm, t.pgd);
}